

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_std::utf8_numpunct_from_wide::do_truename_abi_cxx11_
          (utf8_numpunct_from_wide *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x18));
  return in_RDI;
}

Assistant:

virtual std::string do_truename() const
    {
        return truename_;
    }